

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture_KVDataTest_KVDataDeserialized_Test::TestBody
          (ktxTexture_KVDataTest_KVDataDeserialized_Test *this)

{
  bool bVar1;
  Message *pMVar2;
  AssertHelper *this_00;
  long in_RDI;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char t;
  char s;
  ktx_uint32_t valueLen;
  char *pValue;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktx_error_code_e result;
  ktxTexture *texture;
  char (*in_stack_fffffffffffffdb8) [37];
  AssertionResult *in_stack_fffffffffffffdc0;
  ktx_error_code_e *in_stack_fffffffffffffdc8;
  char *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  int line;
  Message *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  Type type;
  AssertHelper *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  char *in_stack_fffffffffffffe30;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe38;
  AssertHelper *in_stack_fffffffffffffe40;
  AssertionResult local_1a8 [2];
  undefined4 local_188;
  undefined4 local_184;
  AssertionResult local_180 [2];
  undefined4 local_15c;
  AssertionResult local_158;
  undefined1 local_146;
  undefined1 local_145;
  undefined1 local_144 [4];
  undefined8 local_140;
  string local_138 [55];
  undefined1 local_101;
  AssertionResult local_100;
  string local_f0 [55];
  undefined1 local_b9;
  AssertionResult local_b8;
  uint local_a4;
  string local_a0 [40];
  undefined8 local_78;
  undefined1 local_61;
  AssertionResult local_60 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  undefined4 local_14;
  long local_10 [2];
  
  type = (Type)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  local_10[0] = 0;
  if (*(long *)(in_RDI + 0x1a0) != 0) {
    local_14 = ktxTexture_CreateFromMemory
                         (*(undefined8 *)(in_RDI + 0x1a0),*(undefined8 *)(in_RDI + 0x1a8),0,local_10
                         );
    local_2c = 0;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
               (ktx_error_code_e *)in_stack_fffffffffffffdc0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffdf0);
      testing::AssertionResult::failure_message((AssertionResult *)0x132969);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffdf0,type,(char *)in_stack_fffffffffffffde0,
                 (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),in_stack_fffffffffffffdd0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe40,(Message *)in_stack_fffffffffffffe38._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdc0);
      testing::Message::~Message((Message *)0x1329c6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x132a34);
    local_61 = local_10[0] != 0;
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffdc0,(bool *)in_stack_fffffffffffffdb8,(type *)0x132a62);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_60);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffdf0);
      testing::Message::operator<<((Message *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      local_78 = ktxErrorString(local_14);
      in_stack_fffffffffffffdf0 =
           (AssertHelper *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffdc0,(char **)in_stack_fffffffffffffdb8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)in_stack_fffffffffffffe38._M_head_impl,in_stack_fffffffffffffe30
                 ,(char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                 in_stack_fffffffffffffe20);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffdf0,type,(char *)in_stack_fffffffffffffde0,
                 (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),in_stack_fffffffffffffdd0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe40,(Message *)in_stack_fffffffffffffe38._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdc0);
      std::__cxx11::string::~string(local_a0);
      testing::Message::~Message((Message *)0x132b86);
    }
    local_a4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x132c30);
    if (local_a4 == 0) {
      local_b9 = *(long *)(local_10[0] + 0x60) == 0;
      testing::AssertionResult::AssertionResult<bool>
                (in_stack_fffffffffffffdc0,(bool *)in_stack_fffffffffffffdb8,(type *)0x132c74);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffdf0);
        pMVar2 = testing::Message::operator<<
                           ((Message *)in_stack_fffffffffffffdc0,
                            (char (*) [32])in_stack_fffffffffffffdb8);
        type = (Type)((ulong)pMVar2 >> 0x20);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)in_stack_fffffffffffffe38._M_head_impl,
                   in_stack_fffffffffffffe30,
                   (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                   in_stack_fffffffffffffe20);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffdf0,type,(char *)in_stack_fffffffffffffde0,
                   (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),in_stack_fffffffffffffdd0);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe40,(Message *)in_stack_fffffffffffffe38._M_head_impl);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdc0);
        std::__cxx11::string::~string(local_f0);
        testing::Message::~Message((Message *)0x132d5f);
      }
      local_a4 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x132e09);
      if (local_a4 == 0) {
        local_101 = *(long *)(local_10[0] + 0x50) != 0;
        testing::AssertionResult::AssertionResult<bool>
                  (in_stack_fffffffffffffdc0,(bool *)in_stack_fffffffffffffdb8,(type *)0x132e4d);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffdf0);
          in_stack_fffffffffffffde0 =
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffdc0,
                          (char (*) [24])in_stack_fffffffffffffdb8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)in_stack_fffffffffffffe38._M_head_impl,
                     in_stack_fffffffffffffe30,
                     (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                     in_stack_fffffffffffffe20);
          std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffdf0,type,(char *)in_stack_fffffffffffffde0,
                     (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),in_stack_fffffffffffffdd0);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffe40,(Message *)in_stack_fffffffffffffe38._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdc0);
          std::__cxx11::string::~string(local_138);
          testing::Message::~Message((Message *)0x132f38);
        }
        local_a4 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x132fe5);
        if (local_a4 == 0) {
          local_14 = ktxHashList_FindValue(local_10[0] + 0x50,"KTXorientation",local_144,&local_140)
          ;
          local_15c = 0;
          testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
                    (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                     (ktx_error_code_e *)in_stack_fffffffffffffdc0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffdf0);
            in_stack_fffffffffffffdd8 =
                 testing::AssertionResult::failure_message((AssertionResult *)0x1330a2);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffdf0,type,(char *)in_stack_fffffffffffffde0,
                       (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),in_stack_fffffffffffffdd0);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffe40,(Message *)in_stack_fffffffffffffe38._M_head_impl);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffdc0);
            testing::Message::~Message((Message *)0x1330ff);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x133170);
          local_184 = __isoc99_sscanf(local_140,"S=%c,T=%c",&local_145,&local_146);
          local_188 = 2;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (int *)in_stack_fffffffffffffdc8,(int *)in_stack_fffffffffffffdc0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_180);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffdf0);
            in_stack_fffffffffffffdd0 =
                 testing::AssertionResult::failure_message((AssertionResult *)0x133219);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffdf0,type,(char *)in_stack_fffffffffffffde0,
                       (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),in_stack_fffffffffffffdd0);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffe40,(Message *)in_stack_fffffffffffffe38._M_head_impl);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffdc0);
            testing::Message::~Message((Message *)0x133276);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1332e4);
          testing::internal::EqHelper::Compare<char,_char,_nullptr>
                    (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (char *)in_stack_fffffffffffffdc8,&in_stack_fffffffffffffdc0->success_);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1a8);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffdf0);
            in_stack_fffffffffffffdc8 =
                 (ktx_error_code_e *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x13335d);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffdf0,type,(char *)in_stack_fffffffffffffde0,
                       (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),in_stack_fffffffffffffdd0);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffe40,(Message *)in_stack_fffffffffffffe38._M_head_impl);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffdc0);
            testing::Message::~Message((Message *)0x1333ba);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x133428);
          testing::internal::EqHelper::Compare<char,_char,_nullptr>
                    (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (char *)in_stack_fffffffffffffdc8,&in_stack_fffffffffffffdc0->success_);
          line = (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
          bVar1 = testing::AssertionResult::operator_cast_to_bool
                            ((AssertionResult *)&stack0xfffffffffffffe30);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffdf0);
            this_00 = (AssertHelper *)
                      testing::AssertionResult::failure_message((AssertionResult *)0x13348f);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffdf0,type,(char *)in_stack_fffffffffffffde0,line,
                       in_stack_fffffffffffffdd0);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffe40,(Message *)in_stack_fffffffffffffe38._M_head_impl);
            testing::internal::AssertHelper::~AssertHelper(this_00);
            testing::Message::~Message((Message *)0x1334dd);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x13353f);
          if (local_10[0] != 0) {
            (*(code *)**(undefined8 **)(local_10[0] + 8))(local_10[0]);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(ktxTexture_KVDataTest, KVDataDeserialized) {
    ktxTexture* texture = 0;
    KTX_error_code result;

    if (ktxMemFile != NULL) {
        result = ktxTexture_CreateFromMemory(ktxMemFile, ktxMemFileLen,
                                             0,
                                             &texture);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);
        ASSERT_TRUE(texture->kvData == NULL) << "Raw KVData should not be loaded";
        ASSERT_TRUE(texture->kvDataHead != NULL) << "KVData not deserialized";

        char* pValue;
        ktx_uint32_t valueLen;
        char s, t;
        result = ktxHashList_FindValue(&texture->kvDataHead,
                                       KTX_ORIENTATION_KEY,
                                       &valueLen, (void**)&pValue);
        EXPECT_EQ(result, KTX_SUCCESS);
        EXPECT_EQ(sscanf(pValue, /*valueLen,*/ KTX_ORIENTATION2_FMT, &s, &t), 2);
        EXPECT_EQ(s,'r');
        EXPECT_EQ(t, 'd');
        if (texture)
            ktxTexture_Destroy(texture);
    }
}